

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O0

llama_kv_cache_view * llama_kv_cache_view_init(llama_kv_cache *kv,int32_t n_seq_max)

{
  int32_t iVar1;
  int32_t in_EDX;
  long *in_RSI;
  llama_kv_cache_view *in_RDI;
  llama_kv_cache_view *result;
  
  in_RDI->n_cells = 0;
  in_RDI->n_seq_max = in_EDX;
  in_RDI->token_count = 0;
  iVar1 = (**(code **)(*in_RSI + 0x60))();
  in_RDI->used_cells = iVar1;
  in_RDI->max_contiguous = 0;
  in_RDI->max_contiguous_idx = -1;
  in_RDI->cells = (llama_kv_cache_view_cell *)0x0;
  in_RDI->cells_sequences = (llama_seq_id *)0x0;
  return in_RDI;
}

Assistant:

llama_kv_cache_view llama_kv_cache_view_init(const llama_kv_cache & kv, int32_t n_seq_max) {
    llama_kv_cache_view result = {
        /*.n_cells            = */ 0,
        /*.n_seq_max          = */ n_seq_max,
        /*.token_count        = */ 0,
        /*.used_cells         = */ kv.get_used_cells(),
        /*.max_contiguous     = */ 0,
        /*.max_contiguous_idx = */ -1,
        /*.cells              = */ nullptr,
        /*.cells_sequences    = */ nullptr,
    };

    return result;
}